

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O1

bool __thiscall
Lib::Set<SAT::SATLiteral,_Lib::DefaultHash>::contains
          (Set<SAT::SATLiteral,_Lib::DefaultHash> *this,SATLiteral val)

{
  Cell *pCVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  size_t i;
  long lVar5;
  Cell *pCVar6;
  bool bVar7;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 local_4;
  
  local_4 = val.field_0;
  uVar3 = 0x811c9dc5;
  lVar5 = 0;
  do {
    uVar3 = (*(byte *)((long)&local_4 + lVar5) ^ uVar3) * 0x1000193;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  uVar4 = 2;
  if (2 < uVar3) {
    uVar4 = uVar3;
  }
  pCVar1 = this->_entries;
  uVar2 = (ulong)uVar4 % (ulong)(uint)this->_capacity;
  uVar3 = pCVar1[uVar2].code;
  bVar7 = uVar3 != 0;
  if (bVar7) {
    pCVar6 = pCVar1 + uVar2;
    do {
      if ((uVar3 == uVar4) &&
         ((anon_union_4_2_6ac8864f_for_SATLiteral_0)(pCVar6->value).field_0._content == val.field_0)
         ) {
        return bVar7;
      }
      pCVar6 = pCVar6 + 1;
      if (pCVar6 == this->_afterLast) {
        pCVar6 = pCVar1;
      }
      uVar3 = pCVar6->code;
      bVar7 = uVar3 != 0;
    } while (bVar7);
  }
  return bVar7;
}

Assistant:

bool contains (Val val) const
  {
    unsigned code = Hash::hash(val);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,val)) {
	return true;
      }
    }
    return false;
  }